

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TIntermediate::addAssign
          (TIntermediate *this,TOperator op,TIntermTyped *left,TIntermTyped *right,TSourceLoc *loc)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TIntermSymbol *left_00;
  undefined4 extraout_var_04;
  TIntermTyped *pTVar4;
  undefined4 extraout_var_05;
  TIntermBinary *node_00;
  TOperator op_00;
  TIntermBinary *node;
  TIntermSymbol *symbol;
  TIntermTyped *node_1;
  TSourceLoc *loc_local;
  TIntermTyped *right_local;
  TIntermTyped *left_local;
  TOperator op_local;
  TIntermediate *this_local;
  
  iVar2 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))();
  if (iVar2 != 0x10) {
    iVar2 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x38))();
    if (iVar2 != 0x10) {
      if (((op == EOpAddAssign) || (op == EOpSubAssign)) &&
         (bVar1 = TIntermTyped::isReference(left), bVar1)) {
        iVar2 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0xc0))();
        if ((uVar3 & 1) != 0) {
          iVar2 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
          uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x138))();
          if ((uVar3 & 1) != 0) {
            op_00 = EOpSub;
            if (op == EOpAddAssign) {
              op_00 = EOpAdd;
            }
            pTVar4 = addBinaryMath(this,op_00,left,right,loc);
            if (pTVar4 == (TIntermTyped *)0x0) {
              return (TIntermTyped *)0x0;
            }
            iVar2 = (*(left->super_TIntermNode)._vptr_TIntermNode[0xc])();
            left_00 = addSymbol(this,(TIntermSymbol *)CONCAT44(extraout_var_03,iVar2));
            pTVar4 = addAssign(this,EOpAssign,&left_00->super_TIntermTyped,pTVar4,loc);
            return pTVar4;
          }
        }
        return (TIntermTyped *)0x0;
      }
      iVar2 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      pTVar4 = addConversion(this,op,(TType *)CONCAT44(extraout_var_04,iVar2),right);
      if (pTVar4 == (TIntermTyped *)0x0) {
        return (TIntermTyped *)0x0;
      }
      iVar2 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      pTVar4 = addUniShapeConversion(this,op,(TType *)CONCAT44(extraout_var_05,iVar2),pTVar4);
      node_00 = addBinaryNode(this,op,left,pTVar4,loc);
      bVar1 = promote(this,&node_00->super_TIntermOperator);
      if (!bVar1) {
        return (TIntermTyped *)0x0;
      }
      (**(code **)(*(long *)&(node_00->super_TIntermOperator).super_TIntermTyped + 0x1a0))();
      return (TIntermTyped *)node_00;
    }
  }
  return (TIntermTyped *)0x0;
}

Assistant:

TIntermTyped* TIntermediate::addAssign(TOperator op, TIntermTyped* left, TIntermTyped* right,
    const TSourceLoc& loc)
{
    // No block assignment
    if (left->getType().getBasicType() == EbtBlock || right->getType().getBasicType() == EbtBlock)
        return nullptr;

    // Convert "reference += int" to "reference = reference + int". We need this because the
    // "reference + int" calculation involves a cast back to the original type, which makes it
    // not an lvalue.
    if ((op == EOpAddAssign || op == EOpSubAssign) && left->isReference()) {
        if (!(right->getType().isScalar() && right->getType().isIntegerDomain()))
            return nullptr;

        TIntermTyped* node = addBinaryMath(op == EOpAddAssign ? EOpAdd : EOpSub, left, right, loc);
        if (!node)
            return nullptr;

        TIntermSymbol* symbol = left->getAsSymbolNode();
        left = addSymbol(*symbol);

        node = addAssign(EOpAssign, left, node, loc);
        return node;
    }

    //
    // Like adding binary math, except the conversion can only go
    // from right to left.
    //

    // convert base types, nullptr return means not possible
    right = addConversion(op, left->getType(), right);
    if (right == nullptr)
        return nullptr;

    // convert shape
    right = addUniShapeConversion(op, left->getType(), right);

    // build the node
    TIntermBinary* node = addBinaryNode(op, left, right, loc);

    if (! promote(node))
        return nullptr;

    node->updatePrecision();

    return node;
}